

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O1

ssize_t __thiscall Buffer::write(Buffer *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  undefined4 in_register_00000034;
  ofstream file;
  long local_218;
  filebuf local_210 [24];
  int aiStack_1f8 [54];
  ios_base local_120 [264];
  
  std::ofstream::ofstream(&local_218,*(char **)CONCAT44(in_register_00000034,__fd),_S_trunc|_S_bin);
  iVar1 = *(int *)((long)aiStack_1f8 + *(long *)(local_218 + -0x18));
  if (iVar1 == 0) {
    std::ostream::write((char *)&local_218,(long)this->data);
    std::ofstream::close();
  }
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _write;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  return CONCAT71((int7)((ulong)this >> 8),iVar1 == 0) & 0xffffffff;
}

Assistant:

bool
Buffer::write(const std::string &path) {
  std::ofstream file(path.c_str(), std::ios::binary | std::ios::trunc);
  if (!file.good()) {
    return false;
  }

  file.write(reinterpret_cast<char*>(data), size);
  file.close();

  return true;
}